

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

xmlParserInputBufferPtr xmlParserInputBufferCreateFd(int fd,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  
  if (-1 < fd) {
    pxVar1 = xmlAllocParserInputBuffer(enc);
    if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
      pxVar1 = (xmlParserInputBufferPtr)0x0;
    }
    else {
      pxVar1->context = (void *)(ulong)(uint)fd;
      pxVar1->readcallback = xmlFdRead;
      pxVar1->closecallback = xmlFdClose;
    }
    return pxVar1;
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFd(int fd, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (fd < 0) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = (void *) (ptrdiff_t) fd;
	ret->readcallback = xmlFdRead;
	ret->closecallback = xmlFdClose;
    }

    return(ret);
}